

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::readSet(DumpReader *this,int whichFrame)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  long lVar4;
  int in_ESI;
  undefined8 *in_RDI;
  int nSD;
  istream *inputStream;
  string line;
  istream *in_stack_000002d8;
  DumpReader *in_stack_000002e0;
  istream *in_stack_ffffffffffffffb8;
  DumpReader *in_stack_ffffffffffffffc0;
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::string::string(local_30);
  std::ios::clear((int)in_RDI + 0x30 + (int)*(undefined8 *)(in_RDI[6] + -0x18));
  pvVar3 = std::vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::operator[]
                     ((vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_> *)
                      (in_RDI + 0x47),(long)local_c);
  std::istream::seekg(in_RDI + 6,pvVar3->_M_off,pvVar3->_M_state);
  std::istream::getline((char *)(in_RDI + 6),(long)in_RDI + 0x256);
  std::__cxx11::string::operator=(local_30,(char *)((long)in_RDI + 0x256));
  lVar4 = std::__cxx11::string::find((char *)local_30,0x421f02);
  if (lVar4 == -1) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: can not find <Snapshot>\n");
    painCave.isFatal = 1;
    simError();
  }
  readFrameProperties(in_stack_000002e0,in_stack_000002d8);
  uVar1 = readStuntDoubles(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::istream::getline((char *)(in_RDI + 6),(long)in_RDI + 0x256);
  std::__cxx11::string::operator=(local_30,(char *)((long)in_RDI + 0x256));
  lVar4 = std::__cxx11::string::find((char *)local_30,0x42205e);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)local_30,0x421f49);
    if (lVar4 == -1) {
      snprintf(painCave.errMsg,2000,"DumpReader Error: can not find </Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    readSiteData(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  uVar2 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)*in_RDI);
  if (uVar1 != uVar2) {
    uVar2 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)*in_RDI);
    snprintf(painCave.errMsg,2000,
             "DumpReader Error: Number of parsed StuntDouble lines (%d)\n\tis not the same as the expected number of Objects (%d)\n"
             ,(ulong)uVar1,(ulong)uVar2);
    painCave.isFatal = 1;
    simError();
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void DumpReader::readSet(int whichFrame) {
    std::string line;

#ifndef IS_MPI
    inFile_.clear();
    inFile_.seekg(framePos_[whichFrame]);

    std::istream& inputStream = inFile_;
#else

    int primaryNode = 0;
    std::stringstream sstream;
    if (worldRank == primaryNode) {
      std::string sendBuffer;

      inFile_.clear();
      inFile_.seekg(framePos_[whichFrame]);

      while (inFile_.getline(buffer, bufferSize)) {
        line = buffer;
        sendBuffer += line;
        sendBuffer += '\n';
        if (line.find("</Snapshot>") != std::string::npos) { break; }
      }

      int sendBufferSize = sendBuffer.size();
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      MPI_Bcast((void*)sendBuffer.c_str(), sendBufferSize, MPI_CHAR,
                primaryNode, MPI_COMM_WORLD);

      sstream.str(sendBuffer);
    } else {
      int sendBufferSize;
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      char* recvBuffer = new char[sendBufferSize + 1];
      assert(recvBuffer);
      recvBuffer[sendBufferSize] = '\0';
      MPI_Bcast(recvBuffer, sendBufferSize, MPI_CHAR, primaryNode,
                MPI_COMM_WORLD);
      sstream.str(recvBuffer);
      delete[] recvBuffer;
    }

    std::istream& inputStream = sstream;
#endif

    inputStream.getline(buffer, bufferSize);

    line = buffer;
    if (line.find("<Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: can not find <Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }

    // read frameData
    readFrameProperties(inputStream);

    // read StuntDoubles
    int nSD = readStuntDoubles(inputStream);

    inputStream.getline(buffer, bufferSize);
    line = buffer;

    if (line.find("<SiteData>") != std::string::npos) {
      // read SiteData
      readSiteData(inputStream);
    } else {
      if (line.find("</Snapshot>") == std::string::npos) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: can not find </Snapshot>\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    if (nSD != info_->getNGlobalIntegrableObjects()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Number of parsed StuntDouble lines (%d)\n"
               "\tis not the same as the expected number of Objects (%d)\n",
               nSD, info_->getNGlobalIntegrableObjects());
      painCave.isFatal = 1;
      simError();
    }
  }